

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide_device.cpp
# Opt level: O3

void embree::addCollisionConstraints(RTCScene scene)

{
  vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_> *this;
  pointer *pppCVar1;
  ClothModel *this_00;
  iterator iVar2;
  uint *puVar3;
  CollisionConstraint *in_RAX;
  ulong uVar4;
  pointer pTVar5;
  RTCScene scene_00;
  pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_> *coll;
  uint *puVar6;
  CollisionConstraint *local_38;
  
  this_00 = *(ClothModel **)(meshes + (ulong)clothID * 8);
  local_38 = in_RAX;
  collide2::ClothModel::clearCollisionConstraints(this_00);
  puVar3 = DAT_002d0d50;
  if (sim_collisions != DAT_002d0d50) {
    this = &this_00->c_constraints_;
    puVar6 = sim_collisions;
    do {
      if ((clothID != *puVar6) && (clothID == puVar6[2])) {
        uVar4 = (ulong)puVar6[3];
        pTVar5 = (this_00->super_Mesh).tris_.super__Vector_base<Triangle,_std::allocator<Triangle>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        scene_00 = (RTCScene)
                   (this_00->m_inv_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if ((*(float *)(scene_00 + (long)pTVar5[uVar4].v0 * 4) != 0.0) ||
           (NAN(*(float *)(scene_00 + (long)pTVar5[uVar4].v0 * 4)))) {
          local_38 = makeCollisionConstraint(scene_00,pTVar5[uVar4].v0,*puVar6,puVar6[1]);
          iVar2._M_current =
               (this_00->c_constraints_).
               super__Vector_base<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (this_00->c_constraints_).
              super__Vector_base<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<embree::collide2::Constraint*,std::allocator<embree::collide2::Constraint*>>
            ::_M_realloc_insert<embree::collide2::Constraint*>
                      ((vector<embree::collide2::Constraint*,std::allocator<embree::collide2::Constraint*>>
                        *)this,iVar2,(Constraint **)&local_38);
          }
          else {
            *iVar2._M_current = &local_38->super_Constraint;
            pppCVar1 = &(this_00->c_constraints_).
                        super__Vector_base<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppCVar1 = *pppCVar1 + 1;
          }
          uVar4 = (ulong)puVar6[3];
          pTVar5 = (this_00->super_Mesh).tris_.
                   super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                   super__Vector_impl_data._M_start;
          scene_00 = (RTCScene)
                     (this_00->m_inv_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
        }
        if ((*(float *)(scene_00 + (long)pTVar5[uVar4].v1 * 4) != 0.0) ||
           (NAN(*(float *)(scene_00 + (long)pTVar5[uVar4].v1 * 4)))) {
          local_38 = makeCollisionConstraint(scene_00,pTVar5[uVar4].v1,*puVar6,puVar6[1]);
          iVar2._M_current =
               (this_00->c_constraints_).
               super__Vector_base<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (this_00->c_constraints_).
              super__Vector_base<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<embree::collide2::Constraint*,std::allocator<embree::collide2::Constraint*>>
            ::_M_realloc_insert<embree::collide2::Constraint*>
                      ((vector<embree::collide2::Constraint*,std::allocator<embree::collide2::Constraint*>>
                        *)this,iVar2,(Constraint **)&local_38);
          }
          else {
            *iVar2._M_current = &local_38->super_Constraint;
            pppCVar1 = &(this_00->c_constraints_).
                        super__Vector_base<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppCVar1 = *pppCVar1 + 1;
          }
          uVar4 = (ulong)puVar6[3];
          pTVar5 = (this_00->super_Mesh).tris_.
                   super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                   super__Vector_impl_data._M_start;
          scene_00 = (RTCScene)
                     (this_00->m_inv_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
        }
        if ((*(float *)(scene_00 + (long)pTVar5[uVar4].v2 * 4) != 0.0) ||
           (NAN(*(float *)(scene_00 + (long)pTVar5[uVar4].v2 * 4)))) {
          local_38 = makeCollisionConstraint(scene_00,pTVar5[uVar4].v2,*puVar6,puVar6[1]);
          iVar2._M_current =
               (this_00->c_constraints_).
               super__Vector_base<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (this_00->c_constraints_).
              super__Vector_base<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<embree::collide2::Constraint*,std::allocator<embree::collide2::Constraint*>>
            ::_M_realloc_insert<embree::collide2::Constraint*>
                      ((vector<embree::collide2::Constraint*,std::allocator<embree::collide2::Constraint*>>
                        *)this,iVar2,(Constraint **)&local_38);
          }
          else {
            *iVar2._M_current = &local_38->super_Constraint;
            pppCVar1 = &(this_00->c_constraints_).
                        super__Vector_base<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppCVar1 = *pppCVar1 + 1;
          }
        }
      }
      puVar6 = puVar6 + 4;
    } while (puVar6 != puVar3);
  }
  return;
}

Assistant:

void addCollisionConstraints (RTCScene scene)
{
  auto & cloth = (collide2::ClothModel &) (*meshes[clothID]);
  cloth.clearCollisionConstraints();
  
  for (auto const & coll : sim_collisions) {
    auto & c0 = coll.first;
    auto & c1 = coll.second;

    // throw out self collisions for now
    if (clothID == c0.first && clothID == c1.first) continue;

    // push back cloth vertex constraints if not fixed
    if (clothID == c1.first) {
      if (cloth.m_inv_[cloth.tris_[c1.second].v0] != 0) {
        auto c = makeCollisionConstraint (scene, cloth.tris_[c1.second].v0, c0.first, c0.second);
        cloth.c_constraints_.push_back (c);
      }
      if (cloth.m_inv_[cloth.tris_[c1.second].v1] != 0) {
        auto c = makeCollisionConstraint (scene, cloth.tris_[c1.second].v1, c0.first, c0.second);
        cloth.c_constraints_.push_back (c);
      }
      if (cloth.m_inv_[cloth.tris_[c1.second].v2] != 0) {
        auto c = makeCollisionConstraint (scene, cloth.tris_[c1.second].v2, c0.first, c0.second);
        cloth.c_constraints_.push_back (c);
      }
    }
  }
}